

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O2

void Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
               (uint32_t len,uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,
               uint64_t *b,uint64_t *res)

{
  uint64_t *puVar1;
  size_t __n;
  long lVar2;
  uint64_t *puVar3;
  uint64_t uVar4;
  uint64_t a_00;
  uint uVar5;
  uint64_t *puVar6;
  ulong uVar7;
  uint64_t *aM;
  uint64_t *puVar8;
  uint32_t uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  undefined4 in_register_0000008c;
  uint64_t *os_15;
  ulong uVar13;
  uint32_t uVar14;
  uint64_t *puVar15;
  uint64_t *puVar16;
  uint64_t *puVar17;
  ulong uVar18;
  uint64_t uStack_110;
  uint64_t *local_108 [4];
  uint64_t *local_e8;
  uint64_t *local_e0;
  uint64_t *local_d8;
  uint64_t *local_d0;
  ulong local_c8;
  uint64_t *local_c0;
  uint64_t *local_b8;
  uint64_t *local_b0;
  uint64_t *local_a8;
  uint64_t *local_a0;
  uint64_t *local_98;
  uint64_t *local_90;
  uint32_t local_84;
  uint64_t *local_80;
  undefined8 local_78;
  uint64_t *ctx_r2;
  ulong local_68;
  uint64_t *local_60;
  uint64_t *local_58;
  uint64_t *os;
  uint64_t *local_48;
  uint64_t *ctx_n;
  uint64_t *local_38;
  
  ctx_r2 = (uint64_t *)CONCAT44(in_register_0000008c,bBits);
  local_68 = (ulong)len;
  uVar18 = (ulong)len;
  uVar13 = uVar18 * 8 + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar13;
  aM = (uint64_t *)((long)local_108 + lVar2);
  puVar1 = (uint64_t *)(uVar18 * 8);
  local_90 = n;
  local_48 = a;
  ctx_n = (uint64_t *)mu;
  local_38 = r2;
  *(undefined8 *)((long)&uStack_110 + lVar2) = 0x1314e0;
  memset(aM,0,(size_t)puVar1);
  puVar16 = local_38;
  puVar3 = ctx_n;
  puVar8 = local_48;
  puVar17 = local_90;
  *(undefined8 *)((long)&uStack_110 + lVar2) = 0x1314fe;
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len,puVar17,(uint64_t)puVar3,puVar16,puVar8,aM);
  puVar17 = (uint64_t *)((long)aM - uVar13);
  local_c8 = uVar13;
  os = puVar1;
  puVar17[-1] = 0x13151f;
  memset(puVar17,0,(size_t)puVar1);
  uVar14 = (uint32_t)local_68;
  local_58 = puVar17;
  if ((uint)ctx_r2 < 200) {
    puVar15 = puVar17 + -(ulong)(uVar14 * 2);
    puVar15[-1] = 0x131550;
    memset(puVar15,0,(ulong)(uVar14 * 2) * 8);
    puVar8 = os;
    puVar1 = local_90;
    puVar15[-1] = 0x131566;
    memcpy(puVar15,puVar1,(size_t)puVar8);
    puVar1 = local_38;
    local_48 = puVar15 + uVar18;
    puVar15[-1] = 0x131581;
    memcpy(puVar15 + uVar18,puVar1,(size_t)puVar8);
    puVar8 = ctx_n;
    puVar1 = local_48;
    uVar13 = local_68;
    os = puVar15;
    puVar15[-1] = 0x13159f;
    Hacl_Bignum_Montgomery_bn_from_mont_u64
              ((uint32_t)uVar13,puVar15,(uint64_t)puVar8,puVar1,puVar17);
    puVar17 = ctx_n;
    puVar1 = local_58;
    puVar6 = (uint64_t *)0x0;
    puVar3 = (uint64_t *)0x0;
    while( true ) {
      puVar16 = ctx_n;
      puVar8 = local_58;
      if ((uint)puVar6 == (uint)ctx_r2) break;
      local_48 = puVar6;
      uVar5 = ~(uint)puVar6 + (uint)ctx_r2;
      puVar8 = (uint64_t *)(ulong)((b[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0);
      local_38 = puVar8;
      for (uVar7 = 0; puVar16 = os, uVar18 != uVar7; uVar7 = uVar7 + 1) {
        uVar11 = aM[uVar7];
        uVar10 = (uVar11 ^ puVar1[uVar7]) & -((ulong)puVar3 ^ (ulong)puVar8);
        puVar1[uVar7] = puVar1[uVar7] ^ uVar10;
        aM[uVar7] = uVar10 ^ uVar11;
      }
      puVar15[-1] = 0x131626;
      bn_almost_mont_mul_u64((uint32_t)uVar13,puVar16,(uint64_t)puVar17,aM,puVar1,aM);
      uVar13 = local_68;
      puVar15[-1] = 0x13163f;
      bn_almost_mont_sqr_u64((uint32_t)uVar13,puVar16,(uint64_t)puVar17,puVar1,puVar1);
      puVar6 = (uint64_t *)(ulong)((int)local_48 + 1);
      puVar3 = local_38;
    }
    for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
      uVar7 = aM[uVar13];
      uVar11 = (uVar7 ^ puVar8[uVar13]) & -(long)puVar3;
      puVar8[uVar13] = puVar8[uVar13] ^ uVar11;
      aM[uVar13] = uVar11 ^ uVar7;
    }
  }
  else {
    local_84 = ((uint)ctx_r2 - 1 >> 6) + 1;
    local_80 = (uint64_t *)(ulong)(uVar14 * 2);
    __n = (long)local_80 * 8;
    puVar17 = puVar17 + -(long)local_80;
    local_48 = puVar17;
    puVar17[-1] = 0x131683;
    memset(puVar17,0,__n);
    puVar8 = os;
    puVar1 = local_90;
    puVar17[-1] = 0x131699;
    memcpy(puVar17,puVar1,(size_t)puVar8);
    puVar1 = local_38;
    local_78 = puVar17 + uVar18;
    puVar17[-1] = 0x1316b0;
    memcpy(puVar17 + uVar18,puVar1,(size_t)puVar8);
    puVar15 = puVar17 + -(ulong)(uVar14 << 4);
    local_60 = puVar15;
    puVar15[-1] = 0x1316ce;
    memset(puVar15,0,(ulong)(uVar14 << 4) * 8);
    puVar15 = (uint64_t *)((long)puVar15 - local_c8);
    puVar15[-1] = 0x1316e8;
    memset(puVar15,0,(size_t)puVar8);
    puVar16 = ctx_n;
    puVar3 = local_48;
    puVar17 = local_60;
    puVar1 = local_78;
    local_a8 = local_60 + uVar18;
    puVar15[-1] = 0x13170b;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar14,puVar3,(uint64_t)puVar16,puVar1,puVar17);
    puVar1 = local_a8;
    puVar15[-1] = 0x13171d;
    memcpy(puVar1,aM,(size_t)puVar8);
    puVar17 = ctx_n;
    puVar8 = local_48;
    puVar1 = local_a8;
    puVar15[-1] = 0x13173a;
    bn_almost_mont_sqr_u64(uVar14,puVar8,(uint64_t)puVar17,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + (long)local_80;
    local_80 = puVar1;
    puVar15[-1] = 0x131756;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar17 = ctx_n;
    puVar1 = local_80;
    puVar15[-1] = 0x13176f;
    bn_almost_mont_mul_u64(uVar14,puVar8,(uint64_t)puVar17,aM,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + uVar14 * 3;
    local_c0 = puVar1;
    puVar15[-1] = 0x13178e;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar17 = ctx_n;
    puVar1 = local_80;
    puVar15[-1] = 0x1317a4;
    bn_almost_mont_sqr_u64(uVar14,puVar8,(uint64_t)puVar17,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + uVar14 * 4;
    local_a0 = puVar1;
    puVar15[-1] = 0x1317c7;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar17 = ctx_n;
    puVar1 = local_a0;
    puVar15[-1] = 0x1317e3;
    bn_almost_mont_mul_u64(uVar14,puVar8,(uint64_t)puVar17,aM,puVar1,puVar15);
    puVar8 = os;
    puVar17 = local_60;
    puVar1 = local_60 + uVar14 * 5;
    local_b8 = puVar1;
    puVar15[-1] = 0x131802;
    memcpy(puVar1,puVar15,(size_t)puVar8);
    puVar3 = ctx_n;
    puVar8 = local_48;
    puVar1 = local_c0;
    puVar15[-1] = 0x13181c;
    bn_almost_mont_sqr_u64(uVar14,puVar8,(uint64_t)puVar3,puVar1,puVar15);
    puVar8 = os;
    local_98 = puVar17 + uVar14 * 6;
    puVar15[-1] = 0x13183a;
    memcpy(puVar17 + uVar14 * 6,puVar15,(size_t)puVar8);
    puVar3 = ctx_n;
    puVar17 = local_48;
    puVar1 = local_98;
    puVar15[-1] = 0x131857;
    bn_almost_mont_mul_u64(uVar14,puVar17,(uint64_t)puVar3,aM,puVar1,puVar15);
    puVar1 = local_60 + uVar14 * 7;
    local_b0 = puVar1;
    puVar15[-1] = 0x131875;
    memcpy(puVar1,puVar15,(size_t)puVar8);
    puVar8 = ctx_n;
    puVar17 = local_48;
    puVar1 = local_a0;
    puVar15[-1] = 0x13188f;
    bn_almost_mont_sqr_u64(uVar14,puVar17,(uint64_t)puVar8,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + uVar14 * 8;
    puVar15[-1] = 0x1318ae;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar8 = ctx_n;
    puVar17 = local_48;
    local_108[0] = puVar1;
    puVar15[-1] = 0x1318ce;
    bn_almost_mont_mul_u64(uVar14,puVar17,(uint64_t)puVar8,aM,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + uVar14 * 9;
    local_108[1] = puVar1;
    puVar15[-1] = 0x1318ed;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar8 = ctx_n;
    puVar17 = local_48;
    puVar1 = local_b8;
    puVar15[-1] = 0x131907;
    bn_almost_mont_sqr_u64(uVar14,puVar17,(uint64_t)puVar8,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + uVar14 * 10;
    puVar15[-1] = 0x131922;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar8 = ctx_n;
    puVar17 = local_48;
    local_108[2] = puVar1;
    puVar15[-1] = 0x131942;
    bn_almost_mont_mul_u64(uVar14,puVar17,(uint64_t)puVar8,aM,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + uVar14 * 0xb;
    local_108[3] = puVar1;
    puVar15[-1] = 0x131961;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar8 = ctx_n;
    puVar17 = local_48;
    puVar1 = local_98;
    puVar15[-1] = 0x13197b;
    bn_almost_mont_sqr_u64(uVar14,puVar17,(uint64_t)puVar8,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + uVar14 * 0xc;
    puVar15[-1] = 0x131996;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar8 = ctx_n;
    puVar17 = local_48;
    local_e8 = puVar1;
    puVar15[-1] = 0x1319b6;
    bn_almost_mont_mul_u64(uVar14,puVar17,(uint64_t)puVar8,aM,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + uVar14 * 0xd;
    local_e0 = puVar1;
    puVar15[-1] = 0x1319d5;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar8 = ctx_n;
    puVar17 = local_48;
    puVar1 = local_b0;
    puVar15[-1] = 0x1319ef;
    bn_almost_mont_sqr_u64(uVar14,puVar17,(uint64_t)puVar8,puVar1,puVar15);
    puVar17 = os;
    puVar1 = local_60 + uVar14 * 0xe;
    puVar15[-1] = 0x131a0a;
    memcpy(puVar1,puVar15,(size_t)puVar17);
    puVar3 = ctx_n;
    puVar8 = local_48;
    puVar17 = local_60;
    local_d8 = puVar1;
    puVar15[-1] = 0x131a2e;
    bn_almost_mont_mul_u64(uVar14,puVar8,(uint64_t)puVar3,aM,puVar1,puVar15);
    puVar8 = os;
    uVar9 = (uint32_t)aM;
    puVar1 = puVar17 + uVar14 * 0xf;
    local_d0 = puVar1;
    puVar15[-1] = 0x131a49;
    memcpy(puVar1,puVar15,(size_t)puVar8);
    puVar16 = ctx_n;
    puVar3 = local_48;
    puVar8 = local_58;
    uVar13 = local_68;
    puVar1 = local_78;
    uVar14 = local_84;
    if (((ulong)ctx_r2 & 3) == 0) {
      puVar15[-1] = 0x131e85;
      Hacl_Bignum_Montgomery_bn_from_mont_u64
                ((uint32_t)uVar13,puVar3,(uint64_t)puVar16,puVar1,puVar8);
      uVar5 = (uint)ctx_r2;
      uVar12 = uVar5;
    }
    else {
      uVar5 = (uint)ctx_r2;
      local_78 = (uint64_t *)(CONCAT44(local_78._4_4_,uVar5) & 0xfffffffffffffffc);
      puVar15[-1] = 0x131a6d;
      puVar3 = (uint64_t *)Hacl_Bignum_Lib_bn_get_bits_u64(uVar14,b,uVar5 & 0xfffffffc,uVar9);
      puVar1 = os;
      puVar8 = local_58;
      puVar15[-1] = 0x131a83;
      memcpy(puVar8,puVar17,(size_t)puVar1);
      puVar15[-1] = 1;
      uVar4 = puVar15[-1];
      local_38 = puVar3;
      puVar15[-1] = 0x131a92;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar3,uVar4);
      puVar1 = local_d0;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar8[uVar13] = puVar8[uVar13] & ~uVar4 | local_a8[uVar13] & uVar4;
      }
      puVar15[-1] = 2;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131b0e;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_80[uVar13] & uVar4;
      }
      puVar15[-1] = 3;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131b49;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_c0[uVar13] & uVar4;
      }
      puVar15[-1] = 4;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131b87;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_a0[uVar13] & uVar4;
      }
      puVar15[-1] = 5;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131bc5;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_b8[uVar13] & uVar4;
      }
      puVar15[-1] = 6;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131c03;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_98[uVar13] & uVar4;
      }
      puVar15[-1] = 7;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131c41;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_b0[uVar13] & uVar4;
      }
      puVar15[-1] = 8;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131c7f;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_108[0][uVar13] & uVar4;
      }
      puVar15[-1] = 9;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131cbd;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_108[1][uVar13] & uVar4;
      }
      puVar15[-1] = 10;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131cfb;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_108[2][uVar13] & uVar4;
      }
      puVar15[-1] = 0xb;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131d39;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_108[3][uVar13] & uVar4;
      }
      puVar15[-1] = 0xc;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131d77;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_e8[uVar13] & uVar4;
      }
      puVar15[-1] = 0xd;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131db5;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_e0[uVar13] & uVar4;
      }
      puVar15[-1] = 0xe;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131df3;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | local_d8[uVar13] & uVar4;
      }
      puVar15[-1] = 0xf;
      puVar17 = local_38;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131e31;
      uVar4 = FStar_UInt64_eq_mask((uint64_t)puVar17,uVar4);
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        local_58[uVar13] = local_58[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar16 = ctx_n;
      puVar8 = local_58;
      uVar5 = (uint)local_78;
      uVar12 = (uint)ctx_r2;
    }
    puVar15 = (uint64_t *)((long)puVar15 - local_c8);
    ctx_r2 = (uint64_t *)(ulong)(uVar12 >> 2);
    local_78 = (uint64_t *)CONCAT44(local_78._4_4_,uVar5 - 4);
    uVar5 = 0;
    while (puVar1 = local_48, uVar5 != (uint)ctx_r2) {
      uVar14 = (uint32_t)local_68;
      local_38 = (uint64_t *)(ulong)uVar5;
      puVar15[-1] = 0x131ed2;
      bn_almost_mont_sqr_u64(uVar14,puVar1,(uint64_t)puVar16,puVar8,puVar8);
      puVar17 = ctx_n;
      puVar15[-1] = 0x131eea;
      bn_almost_mont_sqr_u64(uVar14,puVar1,(uint64_t)puVar17,puVar8,puVar8);
      puVar1 = local_48;
      puVar15[-1] = 0x131eff;
      bn_almost_mont_sqr_u64(uVar14,puVar1,(uint64_t)puVar17,puVar8,puVar8);
      puVar1 = local_48;
      puVar15[-1] = 0x131f14;
      bn_almost_mont_sqr_u64(uVar14,puVar1,(uint64_t)puVar17,puVar8,puVar8);
      uVar14 = local_84;
      uVar9 = (uint)local_78 + (int)local_38 * -4;
      puVar15[-1] = 0x131f30;
      a_00 = Hacl_Bignum_Lib_bn_get_bits_u64(uVar14,b,uVar9,(uint32_t)puVar8);
      puVar17 = os;
      puVar1 = local_60;
      puVar15[-1] = 0x131f43;
      memcpy(puVar15,puVar1,(size_t)puVar17);
      puVar15[-1] = 1;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131f4e;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_a8;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 2;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131f87;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_80;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 3;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131fbd;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_c0;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 4;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x131ff6;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_a0;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 5;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x13202f;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_b8;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 6;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x132068;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_98;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 7;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x1320a1;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_b0;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 8;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x1320da;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_108[0];
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 9;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x132113;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_108[1];
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 10;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x13214c;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_108[2];
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 0xb;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x132185;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_108[3];
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 0xc;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x1321be;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_e8;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 0xd;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x1321f7;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_e0;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 0xe;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x132230;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar1 = local_d8;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 0xf;
      uVar4 = puVar15[-1];
      puVar15[-1] = 0x132269;
      uVar4 = FStar_UInt64_eq_mask(a_00,uVar4);
      puVar16 = ctx_n;
      puVar17 = local_48;
      puVar1 = local_d0;
      for (uVar13 = 0; puVar8 = local_58, uVar7 = local_68, uVar18 != uVar13; uVar13 = uVar13 + 1) {
        puVar15[uVar13] = puVar15[uVar13] & ~uVar4 | puVar1[uVar13] & uVar4;
      }
      puVar15[-1] = 0x1322b8;
      bn_almost_mont_mul_u64((uint32_t)uVar7,puVar17,(uint64_t)puVar16,puVar8,puVar15,puVar8);
      uVar5 = (int)local_38 + 1;
    }
  }
  uVar13 = local_68;
  puVar1 = local_90;
  puVar15[-1] = 0x1322e1;
  Hacl_Bignum_Montgomery_bn_from_mont_u64((uint32_t)uVar13,puVar1,(uint64_t)puVar16,puVar8,res);
  return;
}

Assistant:

void
Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64(
  uint32_t len,
  uint64_t *n,
  uint64_t mu,
  uint64_t *r2,
  uint64_t *a,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *res
)
{
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t aM[len];
    memset(aM, 0U, len * sizeof (uint64_t));
    Hacl_Bignum_Montgomery_bn_to_mont_u64(len, n, mu, r2, a, aM);
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t resM[len];
    memset(resM, 0U, len * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), len + len);
    uint64_t ctx[len + len];
    memset(ctx, 0U, (len + len) * sizeof (uint64_t));
    memcpy(ctx, n, len * sizeof (uint64_t));
    memcpy(ctx + len, r2, len * sizeof (uint64_t));
    uint64_t sw = 0ULL;
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n, mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 64U;
      uint32_t j = (bBits - i0 - 1U) % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      uint64_t sw1 = bit ^ sw;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t dummy = (0ULL - sw1) & (resM[i] ^ aM[i]);
        resM[i] = resM[i] ^ dummy;
        aM[i] = aM[i] ^ dummy;
      }
      uint64_t *ctx_n0 = ctx;
      bn_almost_mont_mul_u64(len, ctx_n0, mu, aM, resM, aM);
      uint64_t *ctx_n1 = ctx;
      bn_almost_mont_sqr_u64(len, ctx_n1, mu, resM, resM);
      sw = bit;
    }
    uint64_t sw0 = sw;
    for (uint32_t i = 0U; i < len; i++)
    {
      uint64_t dummy = (0ULL - sw0) & (resM[i] ^ aM[i]);
      resM[i] = resM[i] ^ dummy;
      aM[i] = aM[i] ^ dummy;
    }
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, n, mu, resM, res);
    return;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t aM[len];
  memset(aM, 0U, len * sizeof (uint64_t));
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len, n, mu, r2, a, aM);
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t resM[len];
  memset(resM, 0U, len * sizeof (uint64_t));
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 64U + 1U;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len + len);
  uint64_t ctx[len + len];
  memset(ctx, 0U, (len + len) * sizeof (uint64_t));
  memcpy(ctx, n, len * sizeof (uint64_t));
  memcpy(ctx + len, r2, len * sizeof (uint64_t));
  KRML_CHECK_SIZE(sizeof (uint64_t), 16U * len);
  uint64_t table[16U * len];
  memset(table, 0U, 16U * len * sizeof (uint64_t));
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint64_t));
  uint64_t *t0 = table;
  uint64_t *t1 = table + len;
  uint64_t *ctx_n0 = ctx;
  uint64_t *ctx_r20 = ctx + len;
  Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, len * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * len;
    uint64_t *ctx_n1 = ctx;
    bn_almost_mont_sqr_u64(len, ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * len, tmp, len * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * len;
    uint64_t *ctx_n = ctx;
    bn_almost_mont_mul_u64(len, ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * len, tmp, len * sizeof (uint64_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i0 = bBits / 4U * 4U;
    uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i0, 4U);
    memcpy(resM, (uint64_t *)(table + 0U * len), len * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_c, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * len;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t *os = resM;
        uint64_t x = (c & res_j[i]) | (~c & resM[i]);
        os[i] = x;
      });
  }
  else
  {
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n, mu, ctx_r2, resM);
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp0[len];
  memset(tmp0, 0U, len * sizeof (uint64_t));
  for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
  {
    KRML_MAYBE_FOR4(i,
      0U,
      4U,
      1U,
      uint64_t *ctx_n = ctx;
      bn_almost_mont_sqr_u64(len, ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i0 - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k, 4U);
    memcpy(tmp0, (uint64_t *)(table + 0U * len), len * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_l, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * len;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t *os = tmp0;
        uint64_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;
      });
    uint64_t *ctx_n = ctx;
    bn_almost_mont_mul_u64(len, ctx_n, mu, resM, tmp0, resM);
  }
  Hacl_Bignum_Montgomery_bn_from_mont_u64(len, n, mu, resM, res);
}